

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

int __thiscall
JsUtil::
BaseHashSet<Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::CharacterBuffer<char16_t>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
::AddNew(BaseHashSet<Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::CharacterBuffer<char16_t>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
         *this,Symbol **element)

{
  Symbol *pSVar1;
  char16_t *pcVar2;
  int iVar3;
  CharacterBuffer<char16_t> local_40;
  
  pSVar1 = *element;
  pcVar2 = (pSVar1->name).string.ptr;
  Memory::Recycler::WBSetBit((char *)&local_40);
  local_40.string.ptr = pcVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_40);
  local_40.len = (pSVar1->name).len;
  iVar3 = BaseDictionary<JsUtil::CharacterBuffer<char16_t>,Symbol*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::HashedEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<JsUtil::CharacterBuffer<char16_t>,Symbol*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::HashedEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                    ((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,Symbol*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::HashedEntry,JsUtil::NoResizeLock>
                      *)this,&local_40,element);
  return iVar3;
}

Assistant:

int AddNew(TElement const& element)
        {
            return __super::AddNew(ValueToKey<TKey, TElement>::ToKey(element), element);
        }